

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O3

void sssort64(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t *buf,
             saidx64_t bufsize,saidx64_t depth,saidx64_t n,saint_t lastsuffix)

{
  byte *pbVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  ulong *puVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong *first_00;
  byte bVar20;
  sauchar_t *psVar21;
  byte *pbVar22;
  ulong *puVar23;
  ulong *puVar24;
  int iVar25;
  sauchar_t *psVar26;
  byte *pbVar27;
  ulong *puVar28;
  byte *pbVar29;
  bool bVar30;
  bool bVar31;
  ulong *local_80;
  ulong *local_70;
  
  puVar7 = (ulong *)(first + 1);
  first_00 = puVar7;
  if (lastsuffix == 0) {
    first_00 = (ulong *)first;
  }
  puVar10 = (ulong *)last;
  local_70 = (ulong *)buf;
  if (0x3ff < bufsize) {
    bVar31 = true;
    goto LAB_00101d66;
  }
  uVar9 = (long)last - (long)first_00;
  uVar13 = (long)uVar9 >> 3;
  bVar31 = true;
  if ((long)uVar13 <= bufsize) goto LAB_00101d66;
  lVar5 = 0x400;
  if ((long)uVar13 < 0x100000) {
    if ((uVar9 & 0x7fff80000) == 0) {
      if ((uVar9 & 0x7f800) == 0) {
        uVar8 = lg_table[uVar13 & 0xff];
      }
      else {
        uVar8 = lg_table[uVar13 >> 8 & 0xff] + 8;
      }
    }
    else if ((uVar9 & 0x7f8000000) == 0) {
      uVar8 = *(int *)((long)lg_table + (ulong)((uint)(uVar13 >> 0xe) & 0x3fc)) + 0x10;
    }
    else {
      uVar8 = lg_table[uVar13 >> 0x18 & 0xff] + 0x18;
    }
    if ((int)uVar8 < 0x10) {
      if ((int)uVar8 < 8) {
        lVar5 = (long)(sqq_table[uVar13] >> 4);
        goto LAB_00101d32;
      }
      lVar5 = (long)((sqq_table[(long)uVar13 >> (((byte)uVar8 & 0xfe) - 6 & 0x3f)] >>
                     (7U - (char)(uVar8 >> 1) & 0x1f)) + 1);
    }
    else {
      lVar5 = (long)(sqq_table[(long)uVar13 >> (((byte)uVar8 & 0xfe) - 6 & 0x3f)] <<
                    ((char)(uVar8 >> 1) - 7U & 0x1f));
      if (0x17 < uVar8) {
        lVar5 = lVar5 + (long)uVar13 / lVar5 + 1 >> 1;
      }
      lVar5 = (long)uVar13 / lVar5 + lVar5 + 1 >> 1;
    }
    lVar5 = lVar5 - (ulong)(lVar5 * lVar5 - uVar13 != 0 && (long)uVar13 <= lVar5 * lVar5);
  }
LAB_00101d32:
  if (bufsize < lVar5) {
    bufsize = 0x400;
    if (lVar5 < 0x400) {
      bufsize = lVar5;
    }
    local_70 = (ulong *)(last + -bufsize);
    bVar31 = lVar5 == 0;
    puVar10 = local_70;
  }
LAB_00101d66:
  if ((long)puVar10 - (long)first_00 < 0x2001) {
    ss_mintrosort(T,PA,(saidx64_t *)first_00,(saidx64_t *)puVar10,depth);
  }
  else {
    uVar9 = 0;
    puVar15 = first_00;
    do {
      local_80 = puVar15 + 0x400;
      ss_mintrosort(T,PA,(saidx64_t *)puVar15,(saidx64_t *)local_80,depth);
      lVar5 = (long)last - (long)local_80 >> 3;
      puVar18 = local_80;
      if (lVar5 <= bufsize) {
        lVar5 = bufsize;
        puVar18 = local_70;
      }
      if ((uVar9 & 1) != 0) {
        lVar14 = 0x400;
        uVar13 = uVar9;
        do {
          lVar3 = -lVar14;
          ss_swapmerge(T,PA,(saidx64_t *)(puVar15 + lVar3),(saidx64_t *)puVar15,
                       (saidx64_t *)(puVar15 + lVar14),(saidx64_t *)puVar18,lVar5,depth);
          lVar14 = lVar14 * 2;
          uVar6 = uVar13 & 2;
          puVar15 = puVar15 + lVar3;
          uVar13 = uVar13 >> 1;
        } while (uVar6 != 0);
      }
      uVar9 = uVar9 + 1;
      puVar15 = local_80;
    } while (0x2000 < (long)puVar10 - (long)local_80);
    ss_mintrosort(T,PA,(saidx64_t *)local_80,(saidx64_t *)puVar10,depth);
    lVar5 = 0x400;
    do {
      if ((uVar9 & 1) != 0) {
        ss_swapmerge(T,PA,(saidx64_t *)(local_80 + -lVar5),(saidx64_t *)local_80,
                     (saidx64_t *)puVar10,(saidx64_t *)local_70,bufsize,depth);
        local_80 = local_80 + -lVar5;
      }
      lVar5 = lVar5 * 2;
      bVar30 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar30);
  }
  if (!bVar31) {
    ss_mintrosort(T,PA,(saidx64_t *)puVar10,last,depth);
    puVar15 = (ulong *)last;
    do {
      uVar9 = puVar15[-1];
      uVar13 = (long)puVar10 - (long)first_00 >> 3;
      puVar18 = first_00;
      if ((long)uVar13 < 1) {
        if (first_00 < puVar10) {
LAB_001020bd:
          uVar13 = (long)puVar10 - (long)puVar18 >> 3;
          if ((0 < (long)uVar13) && (uVar6 = (long)puVar15 - (long)puVar10 >> 3, 0 < (long)uVar6)) {
            puVar24 = puVar18;
            uVar19 = uVar13;
            puVar28 = puVar15;
LAB_001020f4:
            if (uVar19 != uVar6) goto code_r0x001020fd;
            uVar6 = uVar6 + 1;
            lVar5 = 0;
            do {
              uVar2 = *(undefined8 *)((long)puVar24 + lVar5);
              *(undefined8 *)((long)puVar24 + lVar5) = *(undefined8 *)((long)puVar10 + lVar5);
              *(undefined8 *)((long)puVar10 + lVar5) = uVar2;
              lVar5 = lVar5 + 8;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
          }
LAB_001021ae:
          if (puVar18 == first_00) break;
          puVar15 = puVar15 + -uVar13;
          puVar10 = puVar18;
        }
      }
      else {
        uVar19 = (ulong)((long)puVar10 - (long)first_00) >> 4;
        uVar6 = (long)uVar9 >> 0x3f ^ uVar9;
        pbVar1 = T + PA[uVar6] + depth;
        pbVar27 = T + PA[uVar6 + 1] + 2;
        iVar25 = -1;
        do {
          uVar16 = (long)puVar18[uVar19] >> 0x3f ^ puVar18[uVar19];
          pbVar17 = T + PA[uVar16] + depth;
          bVar31 = pbVar17 < T + PA[uVar16 + 1] + 2;
          pbVar22 = pbVar1;
          bVar30 = pbVar1 < pbVar27;
          if ((bVar31) && (pbVar1 < pbVar27)) {
            psVar21 = T + PA[uVar16];
            psVar26 = T + PA[uVar6];
            do {
              bVar20 = psVar21[depth];
              bVar12 = psVar26[depth];
              if (bVar20 != bVar12) goto LAB_00102049;
              pbVar17 = psVar21 + depth + 1;
              pbVar22 = psVar26 + depth + 1;
              bVar30 = pbVar22 < pbVar27;
              psVar21 = psVar21 + 1;
              psVar26 = psVar26 + 1;
              bVar31 = pbVar17 < T + PA[uVar16 + 1] + 2;
            } while ((bVar31) && (pbVar22 < pbVar27));
            pbVar17 = psVar21 + depth;
            pbVar22 = psVar26 + depth;
          }
          if (bVar31) {
            iVar4 = 1;
            if (bVar30 != false) {
              bVar20 = *pbVar17;
              bVar12 = *pbVar22;
LAB_00102049:
              iVar4 = (uint)bVar20 - (uint)bVar12;
            }
          }
          else {
            iVar4 = -(uint)bVar30;
          }
          uVar13 = (ulong)(~(uint)uVar13 & 1);
          puVar24 = puVar18 + uVar19 + 1;
          if (-1 < iVar4) {
            uVar13 = 0;
            puVar24 = puVar18;
            iVar25 = iVar4;
          }
          puVar18 = puVar24;
          uVar13 = uVar19 - uVar13;
          uVar19 = uVar13 >> 1;
        } while (0 < (long)uVar13);
        if (puVar18 < puVar10) {
          if (iVar25 == 0) {
            *puVar18 = ~*puVar18;
          }
          goto LAB_001020bd;
        }
      }
      while (puVar15 = puVar15 + -1, (long)uVar9 < 0) {
        uVar9 = puVar15[-1];
      }
    } while (puVar10 != puVar15);
  }
  if (lastsuffix != 0) {
    uVar9 = *first;
    if (puVar7 < last) {
      lVar5 = PA[uVar9];
      pbVar1 = T + lVar5 + depth;
      pbVar27 = T + n;
      do {
        uVar13 = *puVar7;
        if (-1 < (long)uVar13) {
          pbVar17 = T + PA[uVar13] + depth;
          pbVar29 = T + PA[uVar13 + 1] + 2;
          bVar30 = pbVar17 < pbVar29;
          pbVar22 = pbVar1;
          bVar31 = pbVar1 < pbVar27;
          if ((pbVar1 < pbVar27) && (pbVar17 < pbVar29)) {
            psVar21 = T + PA[uVar13];
            psVar26 = T + lVar5;
            do {
              bVar20 = psVar26[depth];
              if (bVar20 != psVar21[depth]) {
                pbVar17 = psVar21 + depth;
                goto LAB_001022e4;
              }
              pbVar17 = psVar26 + depth + 1;
              pbVar22 = psVar21 + depth + 1;
              bVar30 = pbVar22 < pbVar29;
              psVar26 = psVar26 + 1;
              psVar21 = psVar21 + 1;
              bVar31 = pbVar17 < pbVar27;
            } while ((bVar31) && (pbVar22 < pbVar29));
            pbVar22 = psVar26 + depth;
            pbVar17 = psVar21 + depth;
          }
          if (!bVar31) break;
          if (bVar30) {
            bVar20 = *pbVar22;
LAB_001022e4:
            if (bVar20 <= *pbVar17) break;
          }
        }
        puVar7[-1] = uVar13;
        puVar7 = puVar7 + 1;
      } while (puVar7 < last);
    }
    puVar7[-1] = uVar9;
  }
  return;
code_r0x001020fd:
  if ((long)uVar19 < (long)uVar6) {
    do {
      puVar28 = puVar28 + -1;
      uVar16 = *puVar28;
      puVar11 = puVar10 + -1;
      do {
        *puVar28 = *puVar11;
        puVar23 = puVar28 + -1;
        puVar28 = puVar28 + -1;
        *puVar11 = *puVar23;
        puVar11 = puVar11 + -1;
      } while (puVar24 <= puVar11);
      *puVar28 = uVar16;
      uVar6 = uVar6 + ~uVar19;
    } while ((long)uVar19 < (long)uVar6);
  }
  else {
    do {
      uVar16 = *puVar24;
      puVar11 = puVar10;
      puVar24 = puVar24 + 1;
      do {
        puVar23 = puVar24;
        puVar23[-1] = *puVar11;
        *puVar11 = *puVar23;
        puVar11 = puVar11 + 1;
        puVar24 = puVar23 + 1;
      } while (puVar11 < puVar28);
      *puVar23 = uVar16;
      uVar19 = uVar19 + ~uVar6;
    } while ((long)uVar6 < (long)uVar19);
  }
  if (((long)uVar19 < 1) || ((long)uVar6 < 1)) goto LAB_001021ae;
  goto LAB_001020f4;
}

Assistant:

void
sssort(const sauchar_t *T, const saidx_t *PA,
       saidx_t *first, saidx_t *last,
       saidx_t *buf, saidx_t bufsize,
       saidx_t depth, saidx_t n, saint_t lastsuffix) {
  saidx_t *a;
#if SS_BLOCKSIZE != 0
  saidx_t *b, *middle, *curbuf;
  saidx_t j, k, curbufsize, limit;
#endif
  saidx_t i;

  if(lastsuffix != 0) { ++first; }

#if SS_BLOCKSIZE == 0
  ss_mintrosort(T, PA, first, last, depth);
#else
  if((bufsize < SS_BLOCKSIZE) &&
      (bufsize < (last - first)) &&
      (bufsize < (limit = ss_isqrt(last - first)))) {
    if(SS_BLOCKSIZE < limit) { limit = SS_BLOCKSIZE; }
    buf = middle = last - limit, bufsize = limit;
  } else {
    middle = last, limit = 0;
  }
  for(a = first, i = 0; SS_BLOCKSIZE < (middle - a); a += SS_BLOCKSIZE, ++i) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, a, a + SS_BLOCKSIZE, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, a, a + SS_BLOCKSIZE, depth);
#endif
    curbufsize = last - (a + SS_BLOCKSIZE);
    curbuf = a + SS_BLOCKSIZE;
    if(curbufsize <= bufsize) { curbufsize = bufsize, curbuf = buf; }
    for(b = a, k = SS_BLOCKSIZE, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
      ss_swapmerge(T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
    }
  }
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
  ss_mintrosort(T, PA, a, middle, depth);
#elif 1 < SS_BLOCKSIZE
  ss_insertionsort(T, PA, a, middle, depth);
#endif
  for(k = SS_BLOCKSIZE; i != 0; k <<= 1, i >>= 1) {
    if(i & 1) {
      ss_swapmerge(T, PA, a - k, a, middle, buf, bufsize, depth);
      a -= k;
    }
  }
  if(limit != 0) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, middle, last, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, middle, last, depth);
#endif
    ss_inplacemerge(T, PA, first, middle, last, depth);
  }
#endif

  if(lastsuffix != 0) {
    /* Insert last type B* suffix. */
    saidx_t PAi[2]; PAi[0] = PA[*(first - 1)], PAi[1] = n - 2;
    for(a = first, i = *(first - 1);
        (a < last) && ((*a < 0) || (0 < ss_compare(T, &(PAi[0]), PA + *a, depth)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}